

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O1

Position __thiscall
solitaire::colliders::TableauPileCollider::getCardPosition(TableauPileCollider *this,uint index)

{
  uint uVar1;
  int iVar2;
  Position PVar3;
  uint uVar4;
  
  throwIfInvalidIndex(this,index);
  uVar1 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[8])();
  uVar4 = index;
  if (uVar1 < index) {
    uVar4 = uVar1;
  }
  iVar2 = 0;
  if (uVar1 < index) {
    iVar2 = (uVar1 - index) * -0x10;
  }
  PVar3.y = iVar2 + uVar4 * 3 + (this->position).y;
  PVar3.x = (this->position).x;
  return PVar3;
}

Assistant:

Position TableauPileCollider::getCardPosition(const unsigned index) const {
    throwIfInvalidIndex(index);
    const auto topCoveredCardPosition = tableauPile.getTopCoveredCardPosition();
    return position + getRelativeCardPosition(index, topCoveredCardPosition);
}